

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O3

void Dam_ManCreatePairs(Dam_Man_t *p,int fVerbose)

{
  Gia_Obj_t *pGVar1;
  int *piVar2;
  size_t __size;
  bool bVar3;
  Vec_Int_t *pVVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int v;
  int iVar8;
  uint uVar9;
  Vec_Int_t *p_00;
  int *piVar10;
  Hash_IntMan_t *p_01;
  Vec_Int_t *p_02;
  Gia_Man_t *pGVar11;
  Hash_IntMan_t *pHVar12;
  Vec_Flt_t *pVVar13;
  float *pfVar14;
  Vec_Que_t *pVVar15;
  Vec_Int_t *pVVar16;
  uint *puVar17;
  void *__s;
  uint uVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  long lVar23;
  ulong uVar24;
  int iVar25;
  long lVar26;
  int iVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  double dVar31;
  Vec_Int_t *vRefsXor;
  Vec_Int_t *vRefsAnd;
  int *local_d8;
  int local_b0;
  int local_ac;
  Vec_Flt_t **local_a8;
  long local_88;
  Vec_Int_t *local_60;
  uint *local_58;
  ulong local_50;
  void *local_48;
  ulong local_40;
  Vec_Int_t *local_38;
  
  Dam_ManCollectSets(p);
  pVVar16 = p->pGia->vSuper;
  iVar27 = p->pGia->nObjs;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar27 - 1U) {
    iVar7 = iVar27;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar7;
  iVar5 = 0;
  if (iVar7 == 0) {
    piVar10 = (int *)0x0;
  }
  else {
    piVar10 = (int *)malloc((long)iVar7 << 2);
  }
  p_00->pArray = piVar10;
  p_01 = Hash_IntManStart(iVar27 / 2);
  p_02 = (Vec_Int_t *)malloc(0x10);
  iVar27 = 1000;
  p_02->nCap = 1000;
  local_d8 = (int *)calloc(1,4000);
  p_02->pArray = local_d8;
  p_02->nSize = 1000;
  Dam_ManCreateMultiRefs(p,&local_38,&local_60);
  pVVar4 = local_60;
  pGVar11 = p->pGia;
  if (pGVar11->nObjs < 1) {
    local_88 = 1000;
    local_b0 = 0;
    iVar7 = 0;
    local_ac = 0;
  }
  else {
    lVar23 = 0;
    local_ac = 0;
    iVar7 = 0;
    local_b0 = 0;
    iVar5 = 0;
    do {
      if (pGVar11->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = pGVar11->pObjs + lVar23;
      if (((~*(uint *)pGVar1 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar1) &&
         (lVar23 < p->vNod2Set->nSize)) {
        uVar6 = p->vNod2Set->pArray[lVar23];
        uVar24 = (ulong)uVar6;
        if (uVar24 != 0) {
          if (((int)uVar6 < 0) || (p->vSetStore->nSize <= (int)uVar6)) goto LAB_007055f3;
          piVar10 = p->vSetStore->pArray;
          iVar25 = piVar10[uVar24];
          pVVar16->nSize = 0;
          uVar6 = (uint)*(undefined8 *)pGVar1;
          if (((int)uVar6 < 0) || ((uVar6 & 0x1fffffff) == 0x1fffffff)) {
LAB_007056ad:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                          ,0x280,"void Dam_ManCreatePairs(Dam_Man_t *, int)");
          }
          uVar18 = (uint)((ulong)*(undefined8 *)pGVar1 >> 0x20) & 0x1fffffff;
          if ((uVar6 & 0x1fffffff) < uVar18) {
            iVar8 = piVar10[uVar24];
            if (0 < iVar8) {
              lVar29 = 0;
              do {
                uVar6 = piVar10[uVar24 + lVar29 + 1];
                if ((int)uVar6 < 0) {
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                                ,0x12f,"int Abc_Lit2Var(int)");
                }
                if (pVVar4->nSize <= (int)(uVar6 >> 1)) goto LAB_007055d4;
                if (1 < pVVar4->pArray[uVar6 >> 1]) {
                  Vec_IntPush(pVVar16,uVar6);
                  iVar8 = piVar10[uVar24];
                }
                lVar29 = lVar29 + 1;
              } while (lVar29 < iVar8);
            }
          }
          else {
            if (((uVar6 & 0x1fffffff) <= uVar18) ||
               ((pGVar11->pMuxes != (uint *)0x0 && (pGVar11->pMuxes[lVar23] != 0))))
            goto LAB_007056ad;
            iVar8 = piVar10[uVar24];
            if (0 < iVar8) {
              lVar29 = 0;
              do {
                iVar20 = piVar10[uVar24 + lVar29 + 1];
                if (((long)iVar20 < 0) || (local_38->nSize <= iVar20)) goto LAB_007055d4;
                if (1 < local_38->pArray[iVar20]) {
                  Vec_IntPush(pVVar16,iVar20);
                  iVar8 = piVar10[uVar24];
                }
                lVar29 = lVar29 + 1;
              } while (lVar29 < iVar8);
            }
          }
          iVar5 = iVar5 + ((iVar25 + -1) * iVar25) / 2;
          iVar25 = pVVar16->nSize;
          if (1 < iVar25) {
            local_b0 = local_b0 + ((uint)((iVar25 + -1) * iVar25) >> 1);
            Vec_IntPush(p_00,-(int)lVar23);
            iVar25 = pVVar16->nSize;
            if (0 < iVar25) {
              lVar30 = 1;
              lVar29 = 0;
              do {
                lVar26 = lVar29 + 1;
                uVar24 = (ulong)iVar25;
                if (lVar26 < (long)uVar24) {
                  iVar8 = pVVar16->pArray[lVar29];
                  lVar29 = lVar30;
                  do {
                    iVar25 = pVVar16->pArray[lVar29];
                    bVar3 = iVar25 < iVar8;
                    uVar6 = (uint)*(undefined8 *)pGVar1;
                    iVar20 = iVar8;
                    if ((((~uVar6 & 0x1fffffff) != 0 && -1 < (int)uVar6) &&
                        (uVar6 & 0x1fffffff) <
                        ((uint)((ulong)*(undefined8 *)pGVar1 >> 0x20) & 0x1fffffff)) == bVar3) {
                      iVar20 = iVar25;
                      iVar25 = iVar8;
                    }
                    uVar6 = Hash_Int2ManInsert(p_01,iVar25,iVar20,
                                               (int)CONCAT71((int7)(uVar24 >> 8),bVar3));
                    if ((int)uVar6 < 0) goto LAB_007055f3;
                    uVar18 = uVar6 * 4;
                    uVar19 = p_01->vObjs->nSize;
                    if (uVar19 == uVar18 ||
                        SBORROW4(uVar19,uVar18) != (int)(uVar19 + uVar6 * -4) < 0)
                    goto LAB_007055f3;
                    piVar10 = p_01->vObjs->pArray;
                    iVar25 = piVar10[(ulong)uVar18 + 2];
                    piVar10[(ulong)uVar18 + 2] = iVar25 + 1;
                    if (iVar25 == 1) {
                      uVar18 = (uint)*(undefined8 *)pGVar1;
                      uVar19 = 0;
                      if ((~uVar18 & 0x1fffffff) != 0 && -1 < (int)uVar18) {
                        uVar19 = (uint)((uVar18 & 0x1fffffff) <
                                       ((uint)((ulong)*(undefined8 *)pGVar1 >> 0x20) & 0x1fffffff));
                      }
                      iVar7 = iVar7 + 1;
                      local_ac = local_ac + uVar19;
                    }
                    Vec_IntPush(p_00,uVar6);
                    if (iVar27 <= (int)uVar6) {
                      Vec_IntFillExtra(p_02,(iVar27 * 3) / 2,0);
                    }
                    if ((p->vNodLevR->nSize <= lVar23) ||
                       (iVar27 = p_02->nSize, iVar27 <= (int)uVar6)) goto LAB_007055d4;
                    iVar25 = p->vNodLevR->pArray[lVar23];
                    local_d8 = p_02->pArray;
                    uVar24 = (ulong)uVar6;
                    if (local_d8[uVar24] < iVar25) {
                      local_d8[uVar24] = iVar25;
                    }
                    lVar29 = lVar29 + 1;
                    iVar25 = pVVar16->nSize;
                  } while ((int)lVar29 < iVar25);
                  uVar24 = (ulong)iVar25;
                }
                lVar30 = lVar30 + 1;
                lVar29 = lVar26;
              } while (lVar26 < (long)uVar24);
            }
          }
        }
      }
      lVar23 = lVar23 + 1;
      pGVar11 = p->pGia;
    } while (lVar23 < pGVar11->nObjs);
    local_88 = (long)iVar27;
  }
  if (local_38->pArray != (int *)0x0) {
    free(local_38->pArray);
  }
  free(local_38);
  if (local_60->pArray != (int *)0x0) {
    free(local_60->pArray);
  }
  free(local_60);
  pHVar12 = Hash_IntManStart((iVar7 * 3) / 2);
  p->vHash = pHVar12;
  uVar18 = iVar7 * 2;
  pVVar13 = (Vec_Flt_t *)malloc(0x10);
  uVar6 = 0x10;
  uVar19 = uVar18;
  if (iVar7 * 2 - 1U < 0xf) {
    uVar19 = 0x10;
  }
  pVVar13->nCap = uVar19;
  lVar23 = (long)(int)uVar19;
  if (uVar19 == 0) {
    p->vCounts = pVVar13;
    pfVar14 = (float *)malloc(0x40);
    pVVar13->pArray = pfVar14;
    pVVar13->nCap = 0x10;
  }
  else {
    pfVar14 = (float *)malloc(lVar23 * 4);
    pVVar13->pArray = pfVar14;
    p->vCounts = pVVar13;
    uVar6 = uVar19;
  }
  local_a8 = &p->vCounts;
  pVVar13->nSize = 1;
  *pfVar14 = 1e+09;
  pVVar15 = (Vec_Que_t *)calloc(1,0x20);
  if ((int)uVar6 < 0x11) {
    uVar6 = 0x10;
  }
  pVVar15->nSize = 1;
  pVVar15->nCap = uVar6 + 1;
  __size = (ulong)uVar6 * 4 + 4;
  piVar10 = (int *)malloc(__size);
  memset(piVar10,0xff,__size);
  pVVar15->pHeap = piVar10;
  piVar10 = (int *)malloc(__size);
  memset(piVar10,0xff,__size);
  pVVar15->pOrder = piVar10;
  p->vQue = pVVar15;
  pVVar15->pCostsFlt = &pVVar13->pArray;
  pVVar16 = (Vec_Int_t *)malloc(0x10);
  pVVar16->nSize = 0;
  pVVar16->nCap = uVar19;
  if (uVar19 == 0) {
    piVar10 = (int *)0x0;
  }
  else {
    piVar10 = (int *)malloc(lVar23 * 4);
  }
  pVVar16->pArray = piVar10;
  p->vDiv2Nod = pVVar16;
  Vec_IntPush(pVVar16,1000000000);
  uVar6 = p->pGia->nObjs;
  pVVar16 = (Vec_Int_t *)malloc(0x10);
  uVar9 = 0x10;
  if (0xe < uVar6 - 1) {
    uVar9 = uVar6;
  }
  pVVar16->nSize = 0;
  pVVar16->nCap = uVar9;
  if (uVar9 == 0) {
    piVar10 = (int *)0x0;
  }
  else {
    piVar10 = (int *)malloc((long)(int)uVar9 << 2);
  }
  pVVar16->pArray = piVar10;
  p->vNodStore = pVVar16;
  Vec_IntPush(pVVar16,-1);
  pVVar16 = p_01->vObjs;
  iVar27 = pVVar16->nSize;
  iVar25 = iVar27 + 3;
  if (-1 < iVar27) {
    iVar25 = iVar27;
  }
  uVar22 = iVar25 >> 2;
  uVar6 = uVar22 - 1;
  puVar17 = (uint *)malloc(0x10);
  uVar9 = 0x10;
  if (0xe < uVar6) {
    uVar9 = uVar22;
  }
  *puVar17 = uVar9;
  local_58 = puVar17;
  if (uVar9 == 0) {
    puVar17[2] = 0;
    puVar17[3] = 0;
    puVar17[1] = uVar22;
  }
  else {
    __s = malloc((long)(int)uVar9 << 2);
    *(void **)(puVar17 + 2) = __s;
    puVar17[1] = uVar22;
    if (__s != (void *)0x0) {
      memset(__s,0xff,(long)(int)uVar22 << 2);
      goto LAB_00705023;
    }
  }
  __s = (void *)0x0;
LAB_00705023:
  uVar21 = 0;
  uVar9 = 0;
  if (7 < iVar27) {
    uVar24 = 2;
    if (2 < (int)uVar22) {
      uVar24 = (ulong)uVar22;
    }
    local_40 = (ulong)uVar22;
    uVar9 = 0;
    uVar28 = 1;
    uVar21 = 0;
    local_50 = uVar24;
    local_48 = __s;
    do {
      if ((long)pVVar16->nSize <= (long)(uVar28 * 4)) goto LAB_007055f3;
      piVar10 = pVVar16->pArray;
      iVar27 = piVar10[uVar28 * 4 + 2];
      if (1 < iVar27) {
        iVar25 = 0;
        if (piVar10[uVar28 * 4 + 1] < piVar10[uVar28 * 4]) {
          iVar25 = iVar27;
        }
        v = Hash_Int2ManInsert(p->vHash,piVar10[uVar28 * 4],piVar10[uVar28 * 4 + 1],(int)__s);
        iVar8 = p->vHash->vObjs->nSize;
        iVar20 = iVar8 + 3;
        if (-1 < iVar8) {
          iVar20 = iVar8;
        }
        if (v != (iVar20 >> 2) + -1) {
          __assert_fail("Num == Hash_IntManEntryNum(p->vHash)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                        ,0x2af,"void Dam_ManCreatePairs(Dam_Man_t *, int)");
        }
        pVVar13 = *local_a8;
        if (v != pVVar13->nSize) {
          __assert_fail("Num == Vec_FltSize(p->vCounts)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                        ,0x2b0,"void Dam_ManCreatePairs(Dam_Man_t *, int)");
        }
        if ((long)pVVar16->nSize <= (long)(uVar28 * 4)) goto LAB_007055f3;
        if (local_88 <= (long)uVar28) goto LAB_007055d4;
        iVar8 = Dam_ManDivSlack(p,pVVar16->pArray[uVar28 * 4],pVVar16->pArray[uVar28 * 4 + 1],
                                local_d8[uVar28]);
        uVar22 = pVVar13->nSize;
        if (uVar22 == pVVar13->nCap) {
          if ((int)uVar22 < 0x10) {
            if (pVVar13->pArray == (float *)0x0) {
              pfVar14 = (float *)malloc(0x40);
            }
            else {
              pfVar14 = (float *)realloc(pVVar13->pArray,0x40);
            }
            pVVar13->pArray = pfVar14;
            pVVar13->nCap = 0x10;
          }
          else {
            if (pVVar13->pArray == (float *)0x0) {
              pfVar14 = (float *)malloc((ulong)uVar22 * 8);
            }
            else {
              pfVar14 = (float *)realloc(pVVar13->pArray,(ulong)uVar22 * 8);
            }
            pVVar13->pArray = pfVar14;
            pVVar13->nCap = uVar22 * 2;
          }
        }
        else {
          pfVar14 = pVVar13->pArray;
        }
        iVar20 = pVVar13->nSize;
        pVVar13->nSize = iVar20 + 1;
        pfVar14[iVar20] = (float)iVar8 * 0.005 + (float)iVar27;
        Vec_QuePush(p->vQue,v);
        if (v != p->vDiv2Nod->nSize) {
          __assert_fail("Num == Vec_IntSize(p->vDiv2Nod)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                        ,0x2b4,"void Dam_ManCreatePairs(Dam_Man_t *, int)");
        }
        Vec_IntPush(p->vDiv2Nod,p->vNodStore->nSize);
        Vec_IntPush(p->vNodStore,0);
        Vec_IntFillExtra(p->vNodStore,p->vNodStore->nSize + iVar27,-1);
        if (local_40 <= uVar28) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        uVar21 = uVar21 + iVar27;
        uVar9 = uVar9 + iVar25;
        *(int *)((long)local_48 + uVar28 * 4) = v;
        __s = local_48;
        uVar24 = local_50;
      }
      uVar28 = uVar28 + 1;
    } while (uVar28 != uVar24);
  }
  puVar17 = local_58;
  iVar27 = p->vHash->vObjs->nSize;
  iVar25 = iVar27 + 3;
  if (-1 < iVar27) {
    iVar25 = iVar27;
  }
  if (p->vCounts->nSize != iVar25 >> 2) {
    __assert_fail("Vec_FltSize(p->vCounts) == Hash_IntManEntryNum(p->vHash)+1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                  ,699,"void Dam_ManCreatePairs(Dam_Man_t *, int)");
  }
  if (p->vDiv2Nod->nSize != iVar7 + 1) {
    __assert_fail("Vec_IntSize(p->vDiv2Nod) == nDivsUsed+1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                  ,700,"void Dam_ManCreatePairs(Dam_Man_t *, int)");
  }
  if (pVVar16->pArray != (int *)0x0) {
    free(pVVar16->pArray);
  }
  free(pVVar16);
  pVVar16 = p_01->vTable;
  piVar10 = pVVar16->pArray;
  if (piVar10 != (int *)0x0) {
    free(piVar10);
  }
  free(pVVar16);
  free(p_01);
  if (local_d8 != (int *)0x0) {
    free(local_d8);
  }
  free(p_02);
  iVar27 = p_00->nSize;
  if (0 < (long)iVar27) {
    piVar10 = p_00->pArray;
    iVar25 = -1;
    lVar29 = 0;
    do {
      iVar8 = piVar10[lVar29];
      if ((long)iVar8 < 0) {
        iVar25 = -iVar8;
      }
      else {
        if ((int)puVar17[1] <= iVar8) goto LAB_007055d4;
        uVar22 = *(uint *)(*(long *)(puVar17 + 2) + (long)iVar8 * 4);
        if ((ulong)uVar22 != 0xffffffff) {
          if ((int)uVar22 < 0) {
LAB_007055d4:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar8 = p->vDiv2Nod->pArray[uVar22];
          if (((long)iVar8 < 0) || (p->vNodStore->nSize <= iVar8)) {
LAB_007055f3:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
          }
          piVar2 = p->vNodStore->pArray + iVar8;
          iVar8 = *piVar2;
          *piVar2 = iVar8 + 1;
          piVar2[(long)iVar8 + 1] = iVar25;
        }
      }
      lVar29 = lVar29 + 1;
    } while (iVar27 != lVar29);
  }
  if (*(void **)(puVar17 + 2) != (void *)0x0) {
    free(*(void **)(puVar17 + 2));
  }
  free(puVar17);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  pVVar16 = (Vec_Int_t *)malloc(0x10);
  pVVar16->nCap = uVar19;
  if (uVar19 == 0) {
    pVVar16->pArray = (int *)0x0;
    pVVar16->nSize = uVar18;
  }
  else {
    piVar10 = (int *)malloc(lVar23 << 2);
    pVVar16->pArray = piVar10;
    pVVar16->nSize = uVar18;
    if (piVar10 != (int *)0x0) {
      memset(piVar10,0,(long)(int)uVar18 << 2);
    }
  }
  p->vDivLevR = pVVar16;
  if (fVerbose != 0) {
    printf("Pairs:");
    iVar27 = 1;
    if (1 < iVar5) {
      iVar27 = iVar5;
    }
    dVar31 = (double)iVar27;
    printf("  Total =%9d (%6.2f %%)",((double)iVar5 * 100.0) / dVar31);
    printf("  Tried =%9d (%6.2f %%)",((double)local_b0 * 100.0) / dVar31);
    printf("  Used =%9d (%6.2f %%)",((double)(int)uVar21 * 100.0) / dVar31,(ulong)uVar21);
    printf("  Xor =%9d (%6.2f %%)",((double)(int)uVar9 * 100.0) / dVar31,(ulong)uVar9);
    putchar(10);
    printf("Div:  ");
    uVar18 = 1;
    if (1 < (int)uVar6) {
      uVar18 = uVar6;
    }
    dVar31 = (double)(int)uVar18;
    printf("  Total =%9d (%6.2f %%)",(ulong)uVar6);
    printf("  Tried =%9d (%6.2f %%)",((double)(int)uVar6 * 100.0) / dVar31,(ulong)uVar6);
    printf("  Used =%9d (%6.2f %%)",((double)iVar7 * 100.0) / dVar31);
    printf("  Xor =%9d (%6.2f %%)",((double)local_ac * 100.0) / dVar31);
    putchar(10);
    return;
  }
  return;
}

Assistant:

void Dam_ManCreatePairs( Dam_Man_t * p, int fVerbose )
{
    Gia_Obj_t * pObj;
    Hash_IntMan_t * vHash;
    Vec_Int_t * vRefsAnd, * vRefsXor, * vSuper, * vDivs, * vRemap, * vLevRMax;
    int i, j, k, Num, FanK, FanJ, nRefs, iNode, iDiv, * pSet;
    int nPairsAll = 0, nPairsTried = 0, nPairsUsed = 0, nPairsXor = 0;
    int nDivsAll = 0, nDivsUsed = 0, nDivsXor = 0;
    Dam_ManCollectSets( p );
    vSuper = p->pGia->vSuper;
    vDivs  = Vec_IntAlloc( Gia_ManObjNum(p->pGia) );
    vHash  = Hash_IntManStart( Gia_ManObjNum(p->pGia)/2 );
    vLevRMax = Vec_IntStart( 1000 );
    Dam_ManCreateMultiRefs( p, &vRefsAnd, &vRefsXor );
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        if ( !Dam_ObjHand(p, i) )
            continue;
        pSet = Dam_ObjSet(p, i);
        nPairsAll += pSet[0] * (pSet[0] - 1) / 2;
        Vec_IntClear(vSuper);
        if ( Gia_ObjIsXor(pObj) )
        {
            for ( k = 1; k <= pSet[0]; k++ )
                if ( Vec_IntEntry(vRefsXor, Abc_Lit2Var(pSet[k])) > 1 )
                    Vec_IntPush( vSuper, pSet[k] );
        }
        else if ( Gia_ObjIsAndReal(p->pGia, pObj) )
        {
            for ( k = 1; k <= pSet[0]; k++ )
                if ( Vec_IntEntry(vRefsAnd, pSet[k]) > 1 )
                    Vec_IntPush( vSuper, pSet[k] );
        }
        else assert( 0 );
        if ( Vec_IntSize(vSuper) < 2 )
            continue;
        // enumerate pairs
        nPairsTried += Vec_IntSize(vSuper) * (Vec_IntSize(vSuper) - 1) / 2;
        Vec_IntPush( vDivs, -i ); // remember node
        Vec_IntForEachEntry( vSuper, FanK, k )
        Vec_IntForEachEntryStart( vSuper, FanJ, j, k+1 )
        {
            if ( (FanK > FanJ) ^ Gia_ObjIsXor(pObj) )
                Num = Hash_Int2ManInsert( vHash, FanJ, FanK, 0 );
            else
                Num = Hash_Int2ManInsert( vHash, FanK, FanJ, 0 );
            if ( Hash_Int2ObjInc( vHash, Num ) == 1 )
            {
                nDivsUsed++;
                nDivsXor += Gia_ObjIsXor(pObj);
            }
            Vec_IntPush( vDivs, Num ); // remember devisor
            // update reverse level
            if ( Num >= Vec_IntSize(vLevRMax) )
                Vec_IntFillExtra( vLevRMax, 3 * Vec_IntSize(vLevRMax) / 2, 0 );
            Vec_IntUpdateEntry( vLevRMax, Num, Vec_IntEntry(p->vNodLevR, i) );
        }
    }
    Vec_IntFree( vRefsAnd );
    Vec_IntFree( vRefsXor );
//    Hash_IntManProfile( vHash );
    // remove entries that appear only once
    p->vHash     = Hash_IntManStart( 3 * nDivsUsed /2 );
    p->vCounts   = Vec_FltAlloc( 2 * nDivsUsed );           Vec_FltPush( p->vCounts, ABC_INFINITY );
    p->vQue      = Vec_QueAlloc( Vec_FltCap(p->vCounts) );
    Vec_QueSetPriority( p->vQue, Vec_FltArrayP(p->vCounts) );
    // mapping div to node
    p->vDiv2Nod  = Vec_IntAlloc( 2 * nDivsUsed );           Vec_IntPush( p->vDiv2Nod, ABC_INFINITY );
    p->vNodStore = Vec_IntAlloc( Gia_ManObjNum(p->pGia) );  Vec_IntPush( p->vNodStore, -1 );
    nDivsAll     = Hash_IntManEntryNum(vHash);
    vRemap       = Vec_IntStartFull( nDivsAll+1 );
    for ( i = 1; i <= nDivsAll; i++ )
    {
        nRefs = Hash_IntObjData2(vHash, i);
        if ( nRefs < 2 )
            continue;
        nPairsUsed += nRefs;
        if ( Hash_IntObjData0(vHash, i) > Hash_IntObjData1(vHash, i) )
            nPairsXor += nRefs; 
        Num = Hash_Int2ManInsert( p->vHash, Hash_IntObjData0(vHash, i), Hash_IntObjData1(vHash, i), 0 );
        assert( Num == Hash_IntManEntryNum(p->vHash) );
        assert( Num == Vec_FltSize(p->vCounts) );
        Vec_FltPush( p->vCounts, nRefs + 0.005*Dam_ManDivSlack(p, Hash_IntObjData0(vHash, i), Hash_IntObjData1(vHash, i), Vec_IntEntry(vLevRMax, i)) );
        Vec_QuePush( p->vQue, Num );
        // remember divisors
        assert( Num == Vec_IntSize(p->vDiv2Nod) );
        Vec_IntPush( p->vDiv2Nod, Vec_IntSize(p->vNodStore) );
        Vec_IntPush( p->vNodStore, 0 );
        Vec_IntFillExtra( p->vNodStore, Vec_IntSize(p->vNodStore) + nRefs, -1 );
        // remember entry
        Vec_IntWriteEntry( vRemap, i, Num );
    }
    assert( Vec_FltSize(p->vCounts) == Hash_IntManEntryNum(p->vHash)+1 );
    assert( Vec_IntSize(p->vDiv2Nod) == nDivsUsed+1 );
    Hash_IntManStop( vHash );
    Vec_IntFree( vLevRMax );
    // fill in the divisors
    iNode = -1;
    Vec_IntForEachEntry( vDivs, iDiv, i )
    {
        if ( iDiv < 0 )
        {
            iNode = -iDiv;
            continue;
        }
        Num = Vec_IntEntry( vRemap, iDiv );
        if ( Num == -1 )
            continue;
        pSet = Dam_DivSet( p, Num );
        pSet[++pSet[0]] = iNode;
    }
    Vec_IntFree( vRemap );
    Vec_IntFree( vDivs );
    // create storage for reverse level of divisor during update
    p->vDivLevR = Vec_IntStart( 2 * nDivsUsed );
    // make sure divisors are added correctly
//    for ( i = 1; i <= nDivsUsed; i++ )
//        assert( Dam_DivSet(p, i)[0] == Vec_FltEntry(p->vCounts, i)+1 );
    if ( !fVerbose )
        return;
    // print stats
    printf( "Pairs:" );
    printf( "  Total =%9d (%6.2f %%)", nPairsAll,   100.0 * nPairsAll   / Abc_MaxInt(nPairsAll, 1) );
    printf( "  Tried =%9d (%6.2f %%)", nPairsTried, 100.0 * nPairsTried / Abc_MaxInt(nPairsAll, 1) );
    printf( "  Used =%9d (%6.2f %%)",  nPairsUsed,  100.0 * nPairsUsed  / Abc_MaxInt(nPairsAll, 1) );
    printf( "  Xor =%9d (%6.2f %%)",   nPairsXor,   100.0 * nPairsXor   / Abc_MaxInt(nPairsAll, 1) );
    printf( "\n" );
    printf( "Div:  " );
    printf( "  Total =%9d (%6.2f %%)", nDivsAll,    100.0 * nDivsAll    / Abc_MaxInt(nDivsAll, 1) );
    printf( "  Tried =%9d (%6.2f %%)", nDivsAll,    100.0 * nDivsAll    / Abc_MaxInt(nDivsAll, 1) );
    printf( "  Used =%9d (%6.2f %%)",  nDivsUsed,   100.0 * nDivsUsed   / Abc_MaxInt(nDivsAll, 1) );
    printf( "  Xor =%9d (%6.2f %%)",   nDivsXor,    100.0 * nDivsXor    / Abc_MaxInt(nDivsAll, 1) );
    printf( "\n" );
}